

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O3

Iterator * leveldb::NewErrorIterator(Status *status)

{
  char *state;
  Iterator *pIVar1;
  _func_int **pp_Var2;
  
  pIVar1 = (Iterator *)operator_new(0x30);
  state = status->state_;
  pp_Var2 = (_func_int **)0x0;
  (pIVar1->cleanup_head_).function = (CleanupFunction)0x0;
  (pIVar1->cleanup_head_).next = (CleanupNode *)0x0;
  pIVar1->_vptr_Iterator = (_func_int **)&PTR__EmptyIterator_00116d10;
  if (state != (char *)0x0) {
    pp_Var2 = (_func_int **)Status::CopyState(state);
  }
  pIVar1[1]._vptr_Iterator = pp_Var2;
  return pIVar1;
}

Assistant:

Iterator* NewErrorIterator(const Status& status) {
  return new EmptyIterator(status);
}